

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

ssize_t __thiscall
cmdline::parser::
option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::read(option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  std::__cxx11::string::string((string *)this,(string *)__buf);
  return (ssize_t)this;
}

Assistant:

T read(const std::string& s) {
            return reader(s);
        }